

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRender.cpp
# Opt level: O2

void distributed_render_scene
               (Scene *scene,double half_width,double half_height,int nx,int ny,int nx_sub,
               int ny_sub,char *fname)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  int jSub;
  int iVar6;
  ushort uVar7;
  int iVar8;
  double dVar9;
  ulong in_XMM0_Qb;
  undefined1 auVar10 [16];
  Ray ray;
  double local_178;
  double local_170;
  double local_168;
  long *local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  double local_140;
  double local_138;
  ulong uStack_130;
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  Color local_80;
  char *local_68;
  Ray local_60;
  
  local_d8._0_8_ = (half_width + half_width) / (double)nx;
  local_d8._8_8_ = in_XMM0_Qb;
  local_140 = (half_height + half_height) / (double)ny;
  local_a8._8_2_ = (short)in_XMM0_Qb;
  local_a8._0_8_ = (double)local_d8._0_8_ / (double)nx_sub;
  local_a8._10_2_ = (short)(in_XMM0_Qb >> 0x10);
  local_a8._12_2_ = (short)(in_XMM0_Qb >> 0x20);
  local_a8._14_2_ = (short)(in_XMM0_Qb >> 0x30);
  local_108 = local_140 / (double)ny_sub;
  local_148 = ny;
  local_144 = nx;
  local_138 = half_width;
  uStack_130 = in_XMM0_Qb;
  local_68 = fname;
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&local_160,(int *)&local_68,&local_144);
  uVar4 = uStack_130;
  local_138 = -local_138;
  uStack_130 = uStack_130 ^ 0x8000000000000000;
  local_c8 = (double)(ny_sub * nx_sub);
  iVar6 = 0;
  if (ny_sub < 1) {
    ny_sub = iVar6;
  }
  local_150 = nx_sub;
  if (nx_sub < 1) {
    local_150 = iVar6;
  }
  local_a8._0_8_ = uVar4 ^ 0x8000000000000000;
  local_118 = local_140 * -0.5;
  local_110 = (double)local_d8._0_8_ * -0.5;
  local_170 = half_height;
  dStack_c0 = local_c8;
  local_b8 = local_c8;
  for (; iVar6 < local_148; iVar6 = iVar6 + 1) {
    local_100 = local_118 + local_170;
    local_168 = local_138;
    iVar8 = 0;
    local_154 = iVar6;
    while (iVar8 < local_144) {
      TotalPixels = TotalPixels + 1;
      local_f8 = local_110 + local_168;
      local_128 = ZEXT816(0);
      local_178 = 0.0;
      iVar5 = 0;
      local_158 = iVar8;
      while (iVar5 != local_150) {
        local_f0 = (double)iVar5;
        local_14c = iVar5;
        for (iVar6 = 0; ny_sub != iVar6; iVar6 = iVar6 + 1) {
          dVar9 = rnd();
          local_e0 = (dVar9 + local_f0) * (double)local_a8._0_8_ + local_f8;
          local_e8 = (double)iVar6;
          dVar9 = rnd();
          Scene::camera(scene,local_e0,(local_e8 + dVar9) * local_108 + local_100,&local_60);
          Scene::trace(&local_80,scene,&Grayzer::Medium::air,1.0,&local_60);
          local_178 = local_178 + local_80.x;
          local_128._8_8_ = (double)local_128._8_8_ + local_80.z;
          local_128._0_8_ = (double)local_128._0_8_ + local_80.y;
        }
        iVar6 = local_154;
        iVar5 = local_14c + 1;
      }
      local_178 = local_178 / local_b8;
      auVar3._8_8_ = dStack_c0;
      auVar3._0_8_ = local_c8;
      local_128 = divpd(local_128,auVar3);
      local_98._0_8_ = local_178;
      local_98._8_16_ = local_128;
      clip((Vector *)local_98);
      iVar8 = (int)((double)local_128._0_8_ * 255.0);
      iVar5 = (int)((double)local_128._8_8_ * 255.0);
      sVar1 = (short)iVar8;
      sVar2 = (short)((uint)iVar8 >> 0x10);
      uVar7 = CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar8 >> 0x10) - (0xff < sVar2),
                       (0 < sVar1) * (sVar1 < 0x100) * (char)iVar8 - (0xff < sVar1));
      sVar1 = (short)iVar5;
      sVar2 = (short)((uint)iVar5 >> 0x10);
      auVar10._0_4_ =
           CONCAT13((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar5 >> 0x10) - (0xff < sVar2),
                    CONCAT12((0 < sVar1) * (sVar1 < 0x100) * (char)iVar5 - (0xff < sVar1),uVar7));
      auVar10._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar10._4_2_ = (short)((uint)auVar10._0_4_ >> 0x10);
      (**(code **)(*local_160 + 0x18))
                (local_160,
                 (int)(local_178 * 255.0) & 0xffU | auVar10._4_4_ << 0x10 | (uint)uVar7 << 8);
      local_168 = local_168 + (double)local_d8._0_8_;
      iVar8 = local_158 + 1;
    }
    local_170 = local_170 - local_140;
  }
  if (local_160 != (long *)0x0) {
    (**(code **)(*local_160 + 8))();
  }
  return;
}

Assistant:

void distributed_render_scene(
   Scene* scene,
   double half_width, double half_height,
   int   nx,   int   ny,
   int   nx_sub,  int   ny_sub,
   char const* fname )
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * half_width / nx;      // pixel width
   double hy = 2.0   * half_height /   ny;      // pixel height
   double hx_sub =   hx / nx_sub;         // hz subdivision
   double hy_sub =   hy / ny_sub;         // vt subdivision
   int   i,j;
   int   primary_samples   = nx_sub * ny_sub; // # of samples for each  pixel
   Vector color;

   // make  next in  some higher-level module as: RenderOutFile = new Targa...
   auto tga = std::make_unique<TargaImage>( fname,nx,ny );
   rgb   c;

   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         double x1 = x -   0.5   * hx;
         double y1 = y -   0.5   * hy;
         color =  0;

         TotalPixels++;

         for( int iSub =   0; iSub  < nx_sub; iSub++ )
            for( int jSub =   0; jSub  < ny_sub; jSub++ )
            {
               scene->camera(x1 + hx_sub * (iSub + rnd()),
                     y1 +  hy_sub * (jSub + rnd()), ray );
               color += scene->trace(Grayzer::Medium::air, 1.0, ray);
            }
         color /= primary_samples;
         clip(color);

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}